

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

void NULLCCanvas::CanvasSetColor(uchar red,uchar green,uchar blue,Canvas *ptr)

{
  undefined1 auVar1 [16];
  
  if (ptr != (Canvas *)0x0) {
    auVar1._0_4_ = (float)red;
    auVar1._4_4_ = (float)green;
    auVar1._8_8_ = 0;
    auVar1 = divps(auVar1,_DAT_0034d560);
    *(long *)ptr->color = auVar1._0_8_;
    ptr->color[2] = (float)blue / 255.0;
    ptr->color[3] = 1.0;
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasSetColor(unsigned char red, unsigned char green, unsigned char blue, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		ptr->color[0] = red / 255.0f;
		ptr->color[1] = green / 255.0f;
		ptr->color[2] = blue / 255.0f;
		ptr->color[3] = 1.0f;
	}